

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::neg_dim<2>(any *__return_storage_ptr__,any *val)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *this;
  any *operand;
  allocator local_1c1;
  string local_1c0 [48];
  Read<double> local_190;
  Read<double> local_180;
  Matrix<2,_2> local_170;
  undefined1 local_150 [8];
  Matrix<2,_2> c_1;
  double local_128;
  Vector<2> local_120;
  double local_110;
  any *local_108;
  any *val_local;
  int local_f4;
  double dStack_f0;
  Int i;
  double local_e8;
  double local_e0;
  Vector<2> c;
  double local_b0 [4];
  double local_90;
  double local_88;
  int local_70;
  int local_6c;
  Int j;
  int local_5c;
  double *local_58;
  int local_4c;
  double dStack_48;
  Int i_1;
  double local_40;
  undefined8 local_38;
  Vector<2> c_2;
  
  local_108 = val;
  val_local = __return_storage_ptr__;
  ptVar2 = any::type(val);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
  if (bVar1) {
    local_110 = any_cast<double>(local_108);
    local_110 = -local_110;
    any::any<double,void>(__return_storage_ptr__,&local_110);
  }
  else {
    ptVar2 = any::type(local_108);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<2>::typeinfo);
    if (bVar1) {
      join_0x00001240_0x00001200_ = (double  [2])any_cast<Omega_h::Vector<2>>(local_108);
      dStack_f0 = c_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      local_e8 = local_128;
      for (local_f4 = 0; local_f4 < 2; local_f4 = local_f4 + 1) {
        c.super_Few<double,_2>.array_[1]._4_4_ = local_f4;
        c.super_Few<double,_2>.array_[(long)local_f4 + -1] =
             -c.super_Few<double,_2>.array_[(long)local_f4 + -3];
      }
      local_120.super_Few<double,_2>.array_[0] = local_e0;
      local_120.super_Few<double,_2>.array_[1] = c.super_Few<double,_2>.array_[0];
      any::any<Omega_h::Vector<2>,void>(__return_storage_ptr__,&local_120);
    }
    else {
      ptVar2 = any::type(local_108);
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<2,2>::typeinfo);
      if (bVar1) {
        any_cast<Omega_h::Matrix<2,2>>(&local_170,(Omega_h *)local_108,operand);
        local_b0[0] = local_170.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                      array_[0];
        local_b0[1] = local_170.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                      array_[1];
        local_b0[2] = local_170.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                      array_[0];
        local_b0[3] = local_170.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                      array_[1];
        for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
          local_5c = local_70;
          local_58 = local_b0;
          local_90 = local_58[(long)local_70 * 2];
          local_88 = local_b0[(long)local_70 * 2 + 1];
          for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
            c_2.super_Few<double,_2>.array_[1]._4_4_ = local_4c;
            c_2.super_Few<double,_2>.array_[(long)local_4c + -1] =
                 -c_2.super_Few<double,_2>.array_[(long)local_4c + -3];
          }
          local_6c = local_70;
          _j = local_150;
          *(undefined8 *)(_j + (long)local_70 * 0x10) = local_38;
          c_1.super_Few<Omega_h::Vector<2>,_2>.array_[local_70].super_Few<double,_2>.array_[0] =
               c_2.super_Few<double,_2>.array_[0];
          dStack_48 = local_90;
          local_40 = local_88;
        }
        any::any<Omega_h::Matrix<2,2>,void>(__return_storage_ptr__,(Matrix<2,_2> *)local_150);
      }
      else {
        ptVar2 = any::type(local_108);
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (!bVar1) {
          this = (ParserFail *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1c0,"Invalid operand type to negation operator",&local_1c1);
          ParserFail::ParserFail(this,(string *)local_1c0);
          __cxa_throw(this,&ParserFail::typeinfo,ParserFail::~ParserFail);
        }
        any_cast<Omega_h::Read<double>>((Omega_h *)&local_190,local_108);
        multiply_each_by<double>((Omega_h *)&local_180,&local_190,-1.0);
        any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_180);
        Read<double>::~Read(&local_180);
        Read<double>::~Read(&local_190);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

any neg_dim(any const& val) {
  if (val.type() == typeid(Real)) {
    return -any_cast<Real>(val);
  } else if (val.type() == typeid(Vector<dim>)) {
    return -any_cast<Vector<dim>>(val);
  } else if (val.type() == typeid(Tensor<dim>)) {
    return -any_cast<Tensor<dim>>(val);
  } else if (val.type() == typeid(Reals)) {
    return Reals(multiply_each_by(any_cast<Reals>(val), -1.0));
  } else {
    throw ParserFail("Invalid operand type to negation operator");
  }
}